

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

bool ncnn::vstr_is_float(char *vstr)

{
  int iVar1;
  long in_RDI;
  int j;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if ((0xf < local_14) || (*(char *)(in_RDI + local_14) == '\0')) {
      return false;
    }
    if ((*(char *)(in_RDI + local_14) == '.') ||
       (iVar1 = tolower((int)*(char *)(in_RDI + local_14)), iVar1 == 0x65)) break;
    local_14 = local_14 + 1;
  }
  return true;
}

Assistant:

static bool vstr_is_float(const char vstr[16])
{
    // look ahead for determine isfloat
    for (int j = 0; j < 16; j++)
    {
        if (vstr[j] == '\0')
            break;

        if (vstr[j] == '.' || tolower(vstr[j]) == 'e')
            return true;
    }

    return false;
}